

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

int lws_callback_all_protocol_vhost_args
              (lws_vhost *vh,lws_protocols *protocol,int reason,void *argp,size_t len)

{
  lws_context *context_00;
  lws *plVar1;
  lws *wsi;
  uint m;
  uint n;
  lws_context_per_thread *pt;
  lws_context *context;
  size_t len_local;
  void *argp_local;
  int reason_local;
  lws_protocols *protocol_local;
  lws_vhost *vh_local;
  
  context_00 = vh->context;
  _m = context_00->pt;
  wsi._0_4_ = (int)context_00->count_threads;
  while ((int)wsi != 0) {
    for (wsi._4_4_ = 0; wsi._4_4_ < _m->fds_count; wsi._4_4_ = wsi._4_4_ + 1) {
      plVar1 = wsi_from_fd(context_00,_m->fds[wsi._4_4_].fd);
      if (((plVar1 != (lws *)0x0) && (plVar1->vhost == vh)) &&
         ((plVar1->protocol == protocol || (protocol == (lws_protocols *)0x0)))) {
        (*plVar1->protocol->callback)(plVar1,reason,plVar1->user_space,argp,len);
      }
    }
    _m = _m + 1;
    wsi._0_4_ = (int)wsi + -1;
  }
  return 0;
}

Assistant:

int
lws_callback_all_protocol_vhost_args(struct lws_vhost *vh,
			  const struct lws_protocols *protocol, int reason,
			  void *argp, size_t len)
{
	struct lws_context *context = vh->context;
	struct lws_context_per_thread *pt = &context->pt[0];
	unsigned int n, m = context->count_threads;
	struct lws *wsi;

	while (m--) {
		for (n = 0; n < pt->fds_count; n++) {
			wsi = wsi_from_fd(context, pt->fds[n].fd);
			if (!wsi)
				continue;
			if (wsi->vhost == vh && (wsi->protocol == protocol ||
						 !protocol))
				wsi->protocol->callback(wsi, reason,
						wsi->user_space, argp, len);
		}
		pt++;
	}

	return 0;
}